

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void filterScanline(uchar *out,uchar *scanline,uchar *prevline,size_t length,size_t bytewidth,
                   uchar filterType)

{
  char cVar1;
  ulong uVar2;
  uchar uVar3;
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  ulong in_R8;
  undefined1 in_R9B;
  size_t i;
  ulong local_38;
  
  switch(in_R9B) {
  case 0:
    for (local_38 = 0; local_38 != in_RCX; local_38 = local_38 + 1) {
      *(undefined1 *)(in_RDI + local_38) = *(undefined1 *)(in_RSI + local_38);
    }
    break;
  case 1:
    for (local_38 = 0; uVar2 = in_R8, local_38 != in_R8; local_38 = local_38 + 1) {
      *(undefined1 *)(in_RDI + local_38) = *(undefined1 *)(in_RSI + local_38);
    }
    while (local_38 = uVar2, local_38 < in_RCX) {
      *(char *)(in_RDI + local_38) =
           *(char *)(in_RSI + local_38) - *(char *)(in_RSI + (local_38 - in_R8));
      uVar2 = local_38 + 1;
    }
    break;
  case 2:
    if (in_RDX == 0) {
      for (local_38 = 0; local_38 != in_RCX; local_38 = local_38 + 1) {
        *(undefined1 *)(in_RDI + local_38) = *(undefined1 *)(in_RSI + local_38);
      }
    }
    else {
      for (local_38 = 0; local_38 != in_RCX; local_38 = local_38 + 1) {
        *(char *)(in_RDI + local_38) = *(char *)(in_RSI + local_38) - *(char *)(in_RDX + local_38);
      }
    }
    break;
  case 3:
    if (in_RDX == 0) {
      for (local_38 = 0; uVar2 = in_R8, local_38 != in_R8; local_38 = local_38 + 1) {
        *(undefined1 *)(in_RDI + local_38) = *(undefined1 *)(in_RSI + local_38);
      }
      while (local_38 = uVar2, local_38 < in_RCX) {
        *(char *)(in_RDI + local_38) =
             *(char *)(in_RSI + local_38) -
             (char)((int)(uint)*(byte *)(in_RSI + (local_38 - in_R8)) >> 1);
        uVar2 = local_38 + 1;
      }
    }
    else {
      for (local_38 = 0; uVar2 = in_R8, local_38 != in_R8; local_38 = local_38 + 1) {
        *(char *)(in_RDI + local_38) =
             *(char *)(in_RSI + local_38) - (char)((int)(uint)*(byte *)(in_RDX + local_38) >> 1);
      }
      while (local_38 = uVar2, local_38 < in_RCX) {
        *(char *)(in_RDI + local_38) =
             *(char *)(in_RSI + local_38) -
             (char)((int)((uint)*(byte *)(in_RSI + (local_38 - in_R8)) +
                         (uint)*(byte *)(in_RDX + local_38)) >> 1);
        uVar2 = local_38 + 1;
      }
    }
    break;
  case 4:
    if (in_RDX == 0) {
      for (local_38 = 0; uVar2 = in_R8, local_38 != in_R8; local_38 = local_38 + 1) {
        *(undefined1 *)(in_RDI + local_38) = *(undefined1 *)(in_RSI + local_38);
      }
      while (local_38 = uVar2, local_38 < in_RCX) {
        *(char *)(in_RDI + local_38) =
             *(char *)(in_RSI + local_38) - *(char *)(in_RSI + (local_38 - in_R8));
        uVar2 = local_38 + 1;
      }
    }
    else {
      for (local_38 = 0; uVar2 = in_R8, local_38 != in_R8; local_38 = local_38 + 1) {
        *(char *)(in_RDI + local_38) = *(char *)(in_RSI + local_38) - *(char *)(in_RDX + local_38);
      }
      while (local_38 = uVar2, local_38 < in_RCX) {
        cVar1 = *(char *)(in_RSI + local_38);
        uVar3 = paethPredictor((ushort)*(byte *)(in_RSI + (local_38 - in_R8)),
                               (ushort)*(byte *)(in_RDX + local_38),
                               (ushort)*(byte *)(in_RDX + (local_38 - in_R8)));
        *(uchar *)(in_RDI + local_38) = cVar1 - uVar3;
        uVar2 = local_38 + 1;
      }
    }
  }
  return;
}

Assistant:

static void filterScanline(unsigned char* out, const unsigned char* scanline, const unsigned char* prevline,
  size_t length, size_t bytewidth, unsigned char filterType) {
  size_t i;
  switch (filterType) {
  case 0: /*None*/
    for (i = 0; i != length; ++i) out[i] = scanline[i];
    break;
  case 1: /*Sub*/
    for (i = 0; i != bytewidth; ++i) out[i] = scanline[i];
    for (i = bytewidth; i < length; ++i) out[i] = scanline[i] - scanline[i - bytewidth];
    break;
  case 2: /*Up*/
    if (prevline) {
      for (i = 0; i != length; ++i) out[i] = scanline[i] - prevline[i];
    }
    else {
      for (i = 0; i != length; ++i) out[i] = scanline[i];
    }
    break;
  case 3: /*Average*/
    if (prevline) {
      for (i = 0; i != bytewidth; ++i) out[i] = scanline[i] - (prevline[i] >> 1);
      for (i = bytewidth; i < length; ++i) out[i] = scanline[i] - ((scanline[i - bytewidth] + prevline[i]) >> 1);
    }
    else {
      for (i = 0; i != bytewidth; ++i) out[i] = scanline[i];
      for (i = bytewidth; i < length; ++i) out[i] = scanline[i] - (scanline[i - bytewidth] >> 1);
    }
    break;
  case 4: /*Paeth*/
    if (prevline) {
      /*paethPredictor(0, prevline[i], 0) is always prevline[i]*/
      for (i = 0; i != bytewidth; ++i) out[i] = (scanline[i] - prevline[i]);
      for (i = bytewidth; i < length; ++i) {
        out[i] = (scanline[i] - paethPredictor(scanline[i - bytewidth], prevline[i], prevline[i - bytewidth]));
      }
    }
    else {
      for (i = 0; i != bytewidth; ++i) out[i] = scanline[i];
      /*paethPredictor(scanline[i - bytewidth], 0, 0) is always scanline[i - bytewidth]*/
      for (i = bytewidth; i < length; ++i) out[i] = (scanline[i] - scanline[i - bytewidth]);
    }
    break;
  default: return; /*invalid filter type given*/
  }
}